

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl.h
# Opt level: O0

impl<8UL,_8UL,_false,_void> * __thiscall
avakar::_small_function::impl<8UL,_8UL,_false,_void>::operator=
          (impl<8UL,_8UL,_false,_void> *this,impl<8UL,_8UL,_false,_void> *o)

{
  _func_void_byte_ptr *p_Var1;
  _func_void_byte_ptr_byte_ptr *p_Var2;
  byte *pbVar3;
  byte *pbVar4;
  impl<8UL,_8UL,_false,_void> *o_local;
  impl<8UL,_8UL,_false,_void> *this_local;
  
  if (this->_vtable != (vtable_t<void> *)0x0) {
    p_Var1 = this->_vtable->destroy;
    pbVar3 = storage_t<8UL,_8UL>::data(&this->super_storage_t<8UL,_8UL>);
    (*p_Var1)(pbVar3);
  }
  if (o->_vtable != (vtable_t<void> *)0x0) {
    p_Var2 = o->_vtable->move_destroy;
    pbVar3 = storage_t<8UL,_8UL>::data(&this->super_storage_t<8UL,_8UL>);
    pbVar4 = storage_t<8UL,_8UL>::data(&o->super_storage_t<8UL,_8UL>);
    (*p_Var2)(pbVar3,pbVar4);
  }
  this->_vtable = o->_vtable;
  o->_vtable = (vtable_t<void> *)0x0;
  return this;
}

Assistant:

impl & operator=(impl o) noexcept
	{
		if (_vtable)
			_vtable->destroy(this->data());
		if (o._vtable)
			o._vtable->move_destroy(this->data(), o.data());
		_vtable = o._vtable;
		o._vtable = nullptr;
		return *this;
	}